

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_poll.c
# Opt level: O0

int mpt_stream_poll(mpt_stream *srm,int what,int timeout)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  bool bVar5;
  pollfd *local_68;
  ushort local_5c;
  ushort local_58;
  int ret;
  ssize_t len;
  uint local_40;
  int shared;
  int keep;
  int flags;
  pollfd fd [2];
  uint local_1c;
  int timeout_local;
  int what_local;
  mpt_stream *srm_local;
  
  uVar1 = mpt_stream_flags(&srm->_info);
  local_1c = what;
  if ((uVar1 & 0x10) == 0) {
    local_1c = what & 0xfffffffe;
  }
  if ((uVar1 & 0x20) == 0) {
    local_1c = local_1c & 0xfffffffb;
  }
  local_5c = (ushort)local_1c;
  if ((timeout < 0) && (local_1c == 1)) {
    keep = _mpt_stream_fread(&srm->_info);
    fd[0].fd = -1;
    flags._2_2_ = local_5c;
  }
  else if ((timeout < 0) && (local_1c == 4)) {
    keep = -1;
    flags._2_2_ = 0;
    fd[0].fd = _mpt_stream_fread(&srm->_info);
    fd[0].revents = local_5c;
  }
  else {
    fd[0].revents = 0;
    flags._2_2_ = 0;
    keep = _mpt_stream_fread(&srm->_info);
    fd[0].fd = _mpt_stream_fwrite(&srm->_info);
    if (keep < 0) {
      local_58 = 0;
    }
    else {
      local_58 = local_5c & 0xfffb;
    }
    flags._0_2_ = local_58;
    if (fd[0].fd < 0) {
      local_5c = 0;
    }
    else {
      local_5c = local_5c & 0xfffe;
    }
    fd[0].events = local_5c;
    bVar5 = keep == fd[0].fd;
    if (bVar5) {
      if (keep < 0) {
        piVar3 = __errno_location();
        *piVar3 = 0xb;
        return -2;
      }
      flags._0_2_ = local_58 | local_5c;
    }
    if (keep < 0) {
      local_68 = (pollfd *)fd;
    }
    else {
      local_68 = (pollfd *)&keep;
    }
    iVar2 = 2;
    if (bVar5 || keep < 0) {
      iVar2 = 1;
    }
    iVar2 = poll(local_68,(long)iVar2,timeout);
    if (iVar2 < 0) {
      return iVar2;
    }
    if (bVar5) {
      flags._2_2_ = flags._2_2_ | fd[0].revents;
    }
  }
  local_40 = 0xfffffffd;
  if (keep < 0) {
    if ((srm->_rd).data.len != 0) {
      local_40 = 0;
    }
  }
  else {
    mpt_queue_shift(&srm->_rd);
    if ((flags._2_2_ & 1) == 0) {
      if (-1 < (srm->_rd)._state.data.msg) {
        local_40 = local_1c & 1;
      }
    }
    else if (((srm->_rd).data.len == (srm->_rd).data.max) &&
            (((uVar1 & 0x80) != 0 || (lVar4 = mpt_queue_prepare(&srm->_rd,0x40), lVar4 == 0)))) {
      mpt_stream_seterror(&srm->_info,4);
    }
    else {
      lVar4 = mpt_queue_load(&srm->_rd,keep,0);
      if (lVar4 < 1) {
        if (lVar4 == 0) {
          flags._2_2_ = flags._2_2_ | 0x10;
        }
        else {
          iVar2 = 4;
          if ((flags._2_2_ & 0x10) != 0) {
            iVar2 = 1;
          }
          mpt_stream_seterror(&srm->_info,iVar2);
        }
      }
      else {
        mpt_stream_clearerror(&srm->_info,5);
        local_40 = 1;
      }
    }
    if (((flags._2_2_ & 0x10) != 0) && ((flags._2_2_ & 1) == 0)) {
      mpt_stream_seterror(&srm->_info,4);
    }
  }
  if (-1 < fd[0].fd) {
    if ((flags._2_2_ & 4) == 0) {
      if (((srm->_wd)._state.done != 0) && ((int)local_40 < 0)) {
        local_40 = 0;
      }
    }
    else {
      iVar2 = mpt_stream_flush(srm);
      if (iVar2 < 0) {
        return local_40;
      }
      if (iVar2 != 0) {
        if ((int)local_40 < 0) {
          local_40 = 4;
        }
        else {
          local_40 = local_40 | 4;
        }
      }
      mpt_stream_clearerror(&srm->_info,10);
    }
  }
  return local_40;
}

Assistant:

extern int mpt_stream_poll(MPT_STRUCT(stream) *srm, int what, int timeout)
{
	struct pollfd fd[2];
	int flags, keep;
	
	flags = mpt_stream_flags(&srm->_info);
	
	if (!(flags & MPT_STREAMFLAG(ReadBuf))) {
		what &= ~POLLIN;
	}
	if (!(flags & MPT_STREAMFLAG(WriteBuf))) {
		what &= ~POLLOUT;
	}
	/* fast path for available input */
	if (timeout < 0 && what == POLLIN) {
		fd[0].fd = _mpt_stream_fread(&srm->_info);
		fd[0].revents = what;
		fd[1].fd = -1;
	}
	/* fast path for output */
	else if (timeout < 0 && what == POLLOUT) {
		fd[0].fd = -1;
		fd[0].revents = 0;
		fd[1].fd = _mpt_stream_fread(&srm->_info);
		fd[1].revents = what;
	}
	/* wait for inputs */
	else {
		int shared;
		fd[0].revents = fd[1].revents = 0;
		
		fd[0].fd = _mpt_stream_fread(&srm->_info);
		fd[1].fd = _mpt_stream_fwrite(&srm->_info);
		
		fd[0].events = fd[0].fd < 0 ? 0 : (what & ~POLLOUT);
		fd[1].events = fd[1].fd < 0 ? 0 : (what & ~POLLIN);
		
		if ((shared = (fd[0].fd == fd[1].fd))) {
			if (fd[0].fd < 0) {
				errno = EAGAIN;
				return -2;
			}
			fd[0].events |= fd[1].events;
		}
		if ((keep = poll(fd[0].fd < 0 ? fd+1 : fd, shared || fd[0].fd < 0 ? 1 : 2, timeout)) < 0) {
			return keep;
		}
		if (shared) fd[0].revents |= fd[1].revents;
	}
	keep = -3;
	
	if (fd[0].fd >= 0) {
		ssize_t len;
		
		mpt_queue_shift(&srm->_rd);
		
		/* avoid removal if input available */
		if (!(fd[0].revents & POLLIN)) {
			if (srm->_rd._state.data.msg >= 0) {
				keep = what & POLLIN;
			}
		}
		/* prepare input buffer */
		else if ((srm->_rd.data.len == srm->_rd.data.max)
		         && ((flags & MPT_STREAMFLAG(WriteMap)) || !mpt_queue_prepare(&srm->_rd.data, 64))) {
			mpt_stream_seterror(&srm->_info, MPT_ENUM(ErrorRead));
		}
		/* read further input data */
		else if ((len = mpt_queue_load(&srm->_rd.data, fd[0].fd, 0)) > 0) {
			mpt_stream_clearerror(&srm->_info, MPT_ENUM(ErrorEmpty) | MPT_ENUM(ErrorRead));
			keep = POLLIN;
		}
		/* regular close */
		else if (!len) {
			fd[0].revents |= POLLHUP;
		}
		/* irregular operation */
		else {
			mpt_stream_seterror(&srm->_info, (fd[0].revents & POLLHUP) ? MPT_ENUM(ErrorEmpty) : MPT_ENUM(ErrorRead));
		}
		/* all available data reveived */
		if (fd[0].revents & POLLHUP
		    && !(fd[0].revents & POLLIN)) {
			mpt_stream_seterror(&srm->_info, MPT_ENUM(ErrorRead));
		}
	}
	else if (srm->_rd.data.len) {
		keep = 0;
	}
	if (fd[1].fd >= 0) {
		/* avoid removal if input not queried */
		if (!(fd[0].revents & POLLOUT)) {
			if (srm->_wd._state.done && keep < 0) {
				keep = 0;
			}
		}
		/* remaining data on output */
		else {
			int ret;
			
			if ((ret = mpt_stream_flush(srm)) < 0) {
				return keep;
			}
			if (ret) {
				if (keep < 0) keep = POLLOUT;
				else keep |= POLLOUT;
			}
			mpt_stream_clearerror(&srm->_info, MPT_ENUM(ErrorFull) | MPT_ENUM(ErrorWrite));
		}
	}
	return keep;
}